

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
 booster::locale::impl_icu::generate_formatter<char>(ios_base *ios,Locale *locale,string *encoding)

{
  UBool UVar1;
  fmtflags fVar2;
  int iVar3;
  icu_formatters_cache *piVar4;
  NumberFormat *pNVar5;
  ulong uVar6;
  void *pvVar7;
  uint64_t uVar8;
  icu_std_converter<char,_1> *this;
  SimpleDateFormat *pSVar9;
  TimeZone *pTVar10;
  pointer pDVar11;
  string *in_RCX;
  Locale *in_RDX;
  ios_base *in_RSI;
  UnicodeString *pUVar12;
  __uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
  in_RDI;
  UnicodeString fmt_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f_1;
  icu_std_converter<char,_1> cvt__1;
  EStyle tstyle;
  EStyle dstyle;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  icu_std_converter<char,_1> cvt_;
  UnicodeString pattern;
  int dtf;
  int tmf;
  SimpleDateFormat *sdf;
  DateFormat *df;
  unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> adf;
  fmtflags how_1;
  NumberFormat *nf_2;
  uint64_t curr;
  NumberFormat *nf_1;
  NumberFormat *nf;
  fmtflags how;
  UErrorCode err;
  icu_formatters_cache *cache;
  uint64_t disp;
  ios_info *info;
  unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
  *fmt;
  ios_info *in_stack_fffffffffffff9f8;
  SimpleDateFormat *in_stack_fffffffffffffa00;
  ios_info *in_stack_fffffffffffffa08;
  locale *in_stack_fffffffffffffa10;
  undefined8 in_stack_fffffffffffffa20;
  cpcvt_type cvt_type;
  undefined7 in_stack_fffffffffffffa28;
  undefined1 in_stack_fffffffffffffa2f;
  icu_std_converter<char,_1> *in_stack_fffffffffffffa30;
  string *in_stack_fffffffffffffa40;
  NumberFormat *in_stack_fffffffffffffa48;
  date_format<char> *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffa58;
  char_type *in_stack_fffffffffffffa60;
  icu_std_converter<char,_1> *in_stack_fffffffffffffa68;
  undefined8 in_stack_fffffffffffffae0;
  fmt_type type;
  icu_formatters_cache *in_stack_fffffffffffffae8;
  Locale *in_stack_fffffffffffffb70;
  UnicodeString *in_stack_fffffffffffffb78;
  string local_430 [39];
  undefined1 local_409;
  string local_408 [40];
  string local_3e0 [39];
  undefined1 local_3b9;
  SimpleDateFormat *local_3b8;
  UnicodeString local_3b0 [64];
  UnicodeString local_370 [64];
  string local_330 [32];
  string *local_310;
  string local_308 [80];
  EStyle local_2b8;
  EStyle local_2b4;
  UnicodeString local_2b0 [64];
  UnicodeString local_270 [64];
  string local_230 [32];
  string *local_210;
  string local_208 [80];
  UnicodeString local_1b8 [64];
  int local_178;
  int local_174;
  SimpleDateFormat *local_170;
  SimpleDateFormat *local_168;
  undefined1 local_151;
  string local_150 [39];
  undefined1 local_129;
  string local_128 [39];
  undefined1 local_101;
  string local_100 [36];
  _Ios_Fmtflags local_dc;
  NumberFormat *local_d8;
  undefined1 local_c9;
  string local_c8 [32];
  uint64_t local_a8;
  NumberFormat *local_a0;
  undefined1 local_91;
  string local_90 [32];
  NumberFormat *local_70;
  _Ios_Fmtflags local_64;
  UErrorCode local_60;
  int local_5c;
  locale local_58;
  icu_formatters_cache *local_50;
  uint64_t local_48;
  ios_info *local_30;
  byte local_21;
  string *local_20;
  Locale *local_18;
  ios_base *local_10;
  
  cvt_type = (cpcvt_type)((ulong)in_stack_fffffffffffffa20 >> 0x20);
  type = (fmt_type)((ulong)in_stack_fffffffffffffae0 >> 0x20);
  local_21 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  unique_ptr<booster::locale::impl_icu::formatter<char>,std::default_delete<booster::locale::impl_icu::formatter<char>>>
  ::unique_ptr<std::default_delete<booster::locale::impl_icu::formatter<char>>,void>
            ((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
              *)in_stack_fffffffffffffa00);
  local_30 = ios_info::get((ios_base *)0x267414);
  local_48 = ios_info::display_flags(local_30);
  std::ios_base::getloc((ios_base *)in_stack_fffffffffffff9f8);
  piVar4 = std::use_facet<booster::locale::impl_icu::icu_formatters_cache>
                     (in_stack_fffffffffffffa10);
  std::locale::~locale(&local_58);
  local_50 = piVar4;
  if (local_48 == 0) {
    local_21 = 1;
    local_5c = 1;
    goto LAB_002689ce;
  }
  local_60 = U_ZERO_ERROR;
  switch(local_48) {
  case 1:
    fVar2 = std::ios_base::flags(local_10);
    local_64 = std::operator&(fVar2,_S_floatfield);
    local_70 = (NumberFormat *)0x0;
    if (local_64 == _S_scientific) {
      local_70 = icu_formatters_cache::number_format(in_stack_fffffffffffffae8,type);
    }
    else {
      local_70 = icu_formatters_cache::number_format(in_stack_fffffffffffffae8,type);
    }
    pNVar5 = local_70;
    uVar6 = std::ios_base::precision(local_10);
    (**(code **)(*(long *)pNVar5 + 0xe8))(pNVar5,uVar6 & 0xffffffff);
    pNVar5 = local_70;
    if ((local_64 == _S_scientific) || (local_64 == _S_fixed)) {
      uVar6 = std::ios_base::precision(local_10);
      (**(code **)(*(long *)pNVar5 + 0xf0))(pNVar5,uVar6 & 0xffffffff);
    }
    else {
      (**(code **)(*(long *)local_70 + 0xf0))(local_70,0);
    }
    operator_new(0x40);
    local_91 = 1;
    std::__cxx11::string::string(local_90,local_20);
    number_format<char>::number_format
              ((number_format<char> *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
               in_stack_fffffffffffffa40);
    local_91 = 0;
    std::
    unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
    ::reset((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
             *)in_stack_fffffffffffffa00,(pointer)in_stack_fffffffffffff9f8);
    std::__cxx11::string::~string(local_90);
    break;
  case 2:
    local_a8 = ios_info::currency_flags(local_30);
    if ((local_a8 == 0) || (local_a8 == 0x40)) {
      local_a0 = icu_formatters_cache::number_format(in_stack_fffffffffffffae8,type);
    }
    else {
      local_a0 = icu_formatters_cache::number_format(in_stack_fffffffffffffae8,type);
    }
    operator_new(0x40);
    local_c9 = 1;
    std::__cxx11::string::string(local_c8,local_20);
    number_format<char>::number_format
              ((number_format<char> *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
               in_stack_fffffffffffffa40);
    local_c9 = 0;
    std::
    unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
    ::reset((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
             *)in_stack_fffffffffffffa00,(pointer)in_stack_fffffffffffff9f8);
    std::__cxx11::string::~string(local_c8);
    break;
  case 3:
    pNVar5 = icu_formatters_cache::number_format(in_stack_fffffffffffffae8,type);
    local_d8 = pNVar5;
    uVar6 = std::ios_base::precision(local_10);
    (**(code **)(*(long *)pNVar5 + 0xe8))(pNVar5,uVar6 & 0xffffffff);
    fVar2 = std::ios_base::flags(local_10);
    local_dc = std::operator&(fVar2,_S_floatfield);
    pNVar5 = local_d8;
    if ((local_dc == _S_scientific) || (local_dc == _S_fixed)) {
      uVar6 = std::ios_base::precision(local_10);
      (**(code **)(*(long *)pNVar5 + 0xf0))(pNVar5,uVar6 & 0xffffffff);
    }
    else {
      (**(code **)(*(long *)local_d8 + 0xf0))(local_d8,0);
    }
    operator_new(0x40);
    local_101 = 1;
    std::__cxx11::string::string(local_100,local_20);
    number_format<char>::number_format
              ((number_format<char> *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
               in_stack_fffffffffffffa40);
    local_101 = 0;
    std::
    unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
    ::reset((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
             *)in_stack_fffffffffffffa00,(pointer)in_stack_fffffffffffff9f8);
    std::__cxx11::string::~string(local_100);
    break;
  case 4:
  case 5:
  case 6:
  case 7:
    std::unique_ptr<icu_70::DateFormat,std::default_delete<icu_70::DateFormat>>::
    unique_ptr<std::default_delete<icu_70::DateFormat>,void>
              ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
               in_stack_fffffffffffffa00);
    local_168 = (SimpleDateFormat *)0x0;
    local_170 = icu_formatters_cache::date_formatter
                          ((icu_formatters_cache *)
                           CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
    if (local_170 != (SimpleDateFormat *)0x0) {
      uVar8 = ios_info::time_flags(local_30);
      iVar3 = (int)uVar8;
      if (iVar3 == 0) {
LAB_00267e18:
        local_174 = 1;
      }
      else if (iVar3 == 0x80) {
        local_174 = 0;
      }
      else {
        if (iVar3 == 0x100) goto LAB_00267e18;
        if (iVar3 == 0x180) {
          local_174 = 2;
        }
        else {
          if (iVar3 != 0x200) goto LAB_00267e18;
          local_174 = 3;
        }
      }
      uVar8 = ios_info::date_flags(local_30);
      iVar3 = (int)uVar8;
      if (iVar3 == 0) {
LAB_00267ec6:
        local_178 = 1;
      }
      else if (iVar3 == 0x400) {
        local_178 = 0;
      }
      else {
        if (iVar3 == 0x800) goto LAB_00267ec6;
        if (iVar3 == 0xc00) {
          local_178 = 2;
        }
        else {
          if (iVar3 != 0x1000) goto LAB_00267ec6;
          local_178 = 3;
        }
      }
      icu_70::UnicodeString::UnicodeString((UnicodeString *)in_stack_fffffffffffffa00);
      switch(local_48) {
      case 4:
        icu_70::UnicodeString::operator=
                  (local_1b8,(UnicodeString *)(&local_50->field_0x10 + (long)local_178 * 0x40));
        break;
      case 5:
        icu_70::UnicodeString::operator=
                  (local_1b8,(UnicodeString *)(&local_50->field_0x110 + (long)local_174 * 0x40));
        break;
      case 6:
        icu_70::UnicodeString::operator=
                  (local_1b8,
                   (UnicodeString *)
                   (&local_50->field_0x210 + (long)local_174 * 0x40 + (long)local_178 * 0x100));
        break;
      case 7:
        UVar1 = icu_70::UnicodeString::isEmpty((UnicodeString *)&local_50->field_0x50);
        if (((UVar1 == '\0') &&
            (UVar1 = icu_70::UnicodeString::isEmpty((UnicodeString *)&local_50->field_0x150),
            UVar1 == '\0')) &&
           (UVar1 = icu_70::UnicodeString::isEmpty((UnicodeString *)&local_50->field_0x350),
           UVar1 == '\0')) {
          std::__cxx11::string::string(local_208,local_20);
          icu_std_converter<char,_1>::icu_std_converter
                    (in_stack_fffffffffffffa30,
                     (string *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),
                     cvt_type);
          std::__cxx11::string::~string(local_208);
          ios_info::date_time_pattern<char>(in_stack_fffffffffffffa08);
          local_210 = local_230;
          std::__cxx11::string::c_str();
          std::__cxx11::string::c_str();
          std::__cxx11::string::size();
          icu_std_converter<char,_1>::icu
                    (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                     (char_type *)in_stack_fffffffffffffa58);
          strftime_to_icu(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
          icu_70::UnicodeString::operator=(local_1b8,local_270);
          icu_70::UnicodeString::~UnicodeString(local_270);
          icu_70::UnicodeString::~UnicodeString(local_2b0);
          std::__cxx11::string::~string(local_230);
          icu_std_converter<char,_1>::~icu_std_converter((icu_std_converter<char,_1> *)0x268179);
        }
      }
      UVar1 = icu_70::UnicodeString::isEmpty(local_1b8);
      if (UVar1 == '\0') {
        (**(code **)(*(long *)local_170 + 0x100))(local_170,local_1b8);
        local_168 = local_170;
      }
      local_170 = (SimpleDateFormat *)0x0;
      icu_70::UnicodeString::~UnicodeString(local_1b8);
    }
    if (local_168 == (SimpleDateFormat *)0x0) {
      local_2b4 = DEFAULT;
      local_2b8 = DEFAULT;
      uVar8 = ios_info::time_flags(local_30);
      if (uVar8 == 0x80) {
        local_2b8 = SHORT;
      }
      else if (uVar8 == 0x100) {
        local_2b8 = DEFAULT;
      }
      else if (uVar8 == 0x180) {
        local_2b8 = LONG;
      }
      else if (uVar8 == 0x200) {
        local_2b8 = FULL;
      }
      this = (icu_std_converter<char,_1> *)ios_info::date_flags(local_30);
      if (this == (icu_std_converter<char,_1> *)0x400) {
        local_2b4 = SHORT;
      }
      else if (this == (icu_std_converter<char,_1> *)0x800) {
        local_2b4 = DEFAULT;
      }
      else if (this == (icu_std_converter<char,_1> *)0xc00) {
        local_2b4 = LONG;
      }
      else if (this == (icu_std_converter<char,_1> *)0x1000) {
        local_2b4 = FULL;
      }
      if (local_48 == 4) {
        icu_70::DateFormat::createDateInstance(local_2b4,local_18);
        std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::reset
                  ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
                   in_stack_fffffffffffffa00,(pointer)in_stack_fffffffffffff9f8);
      }
      else if (local_48 == 5) {
        in_stack_fffffffffffffa58 =
             (string *)icu_70::DateFormat::createTimeInstance(local_2b8,local_18);
        std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::reset
                  ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
                   in_stack_fffffffffffffa00,(pointer)in_stack_fffffffffffff9f8);
      }
      else if (local_48 == 6) {
        in_stack_fffffffffffffa50 =
             (date_format<char> *)
             icu_70::DateFormat::createDateTimeInstance(local_2b4,local_2b8,local_18);
        std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::reset
                  ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
                   in_stack_fffffffffffffa00,(pointer)in_stack_fffffffffffff9f8);
      }
      else {
        std::__cxx11::string::string(local_308,local_20);
        icu_std_converter<char,_1>::icu_std_converter
                  (in_stack_fffffffffffffa30,
                   (string *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),cvt_type)
        ;
        std::__cxx11::string::~string(local_308);
        ios_info::date_time_pattern<char>(in_stack_fffffffffffffa08);
        local_310 = local_330;
        in_stack_fffffffffffffa48 = (NumberFormat *)std::__cxx11::string::data();
        in_stack_fffffffffffffa40 = (string *)std::__cxx11::string::data();
        std::__cxx11::string::size();
        icu_std_converter<char,_1>::icu
                  (this,in_stack_fffffffffffffa60,(char_type *)in_stack_fffffffffffffa58);
        pUVar12 = local_3b0;
        strftime_to_icu(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
        icu_70::UnicodeString::~UnicodeString(local_3b0);
        pSVar9 = (SimpleDateFormat *)icu_70::UMemory::operator_new((UMemory *)0x360,(ulong)pUVar12);
        local_3b9 = 0;
        if (pSVar9 != (SimpleDateFormat *)0x0) {
          local_3b9 = 1;
          local_3b8 = pSVar9;
          icu_70::SimpleDateFormat::SimpleDateFormat(pSVar9,local_370,local_18,&local_60);
        }
        std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::reset
                  ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
                   in_stack_fffffffffffffa00,(pointer)in_stack_fffffffffffff9f8);
        icu_70::UnicodeString::~UnicodeString(local_370);
        std::__cxx11::string::~string(local_330);
        icu_std_converter<char,_1>::~icu_std_converter((icu_std_converter<char,_1> *)0x268603);
      }
      UVar1 = U_FAILURE(local_60);
      if (UVar1 == '\0') {
        local_168 = (SimpleDateFormat *)
                    std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::
                    get((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
                        in_stack_fffffffffffffa00);
        goto LAB_00268724;
      }
      local_21 = 1;
      local_5c = 1;
    }
    else {
LAB_00268724:
      pSVar9 = local_168;
      ios_info::time_zone_abi_cxx11_(in_stack_fffffffffffff9f8);
      pTVar10 = get_time_zone(in_stack_fffffffffffffa58);
      (**(code **)(*(long *)pSVar9 + 0xb8))(pSVar9,pTVar10);
      std::__cxx11::string::~string(local_3e0);
      pDVar11 = std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::get
                          ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>
                            *)in_stack_fffffffffffffa00);
      if (pDVar11 == (pointer)0x0) {
        operator_new(0x48);
        in_stack_fffffffffffffa00 = local_168;
        std::__cxx11::string::string(local_430,local_20);
        date_format<char>::date_format
                  (in_stack_fffffffffffffa50,(DateFormat *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa40);
        std::
        unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
        ::reset((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                 *)in_stack_fffffffffffffa00,(pointer)in_stack_fffffffffffff9f8);
        std::__cxx11::string::~string(local_430);
      }
      else {
        operator_new(0x48);
        local_409 = 1;
        std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::unique_ptr
                  ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
                   in_stack_fffffffffffffa00,
                   (unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
                   in_stack_fffffffffffff9f8);
        std::__cxx11::string::string(local_408,local_20);
        date_format<char>::date_format
                  (in_stack_fffffffffffffa50,
                   (unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
                   in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
        local_409 = 0;
        std::
        unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
        ::reset((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                 *)in_stack_fffffffffffffa00,(pointer)in_stack_fffffffffffff9f8);
        std::__cxx11::string::~string(local_408);
        std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::~unique_ptr
                  ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
                   in_stack_fffffffffffffa00);
      }
      local_5c = 0;
    }
    std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::~unique_ptr
              ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
               in_stack_fffffffffffffa00);
    if (local_5c != 0) goto LAB_002689ce;
    break;
  case 8:
    pvVar7 = operator_new(0x40);
    local_129 = 1;
    icu_formatters_cache::number_format(in_stack_fffffffffffffae8,(fmt_type)((ulong)pvVar7 >> 0x20))
    ;
    std::__cxx11::string::string(local_128,local_20);
    number_format<char>::number_format
              ((number_format<char> *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
               in_stack_fffffffffffffa40);
    local_129 = 0;
    std::
    unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
    ::reset((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
             *)in_stack_fffffffffffffa00,(pointer)in_stack_fffffffffffff9f8);
    std::__cxx11::string::~string(local_128);
    break;
  case 9:
    operator_new(0x40);
    local_151 = 1;
    icu_formatters_cache::number_format(in_stack_fffffffffffffae8,type);
    std::__cxx11::string::string(local_150,local_20);
    number_format<char>::number_format
              ((number_format<char> *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
               in_stack_fffffffffffffa40);
    local_151 = 0;
    std::
    unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
    ::reset((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
             *)in_stack_fffffffffffffa00,(pointer)in_stack_fffffffffffff9f8);
    std::__cxx11::string::~string(local_150);
  }
  local_21 = 1;
  local_5c = 1;
LAB_002689ce:
  if ((local_21 & 1) == 0) {
    std::
    unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
    ::~unique_ptr((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                   *)in_stack_fffffffffffffa00);
  }
  return (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
          )(tuple<booster::locale::impl_icu::formatter<char>_*,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
            )in_RDI.
             super___uniq_ptr_impl<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_booster::locale::impl_icu::formatter<char>_*,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
             .super__Head_base<0UL,_booster::locale::impl_icu::formatter<char>_*,_false>.
             _M_head_impl;
}

Assistant:

std::unique_ptr<formatter<CharType> > generate_formatter(
                    std::ios_base &ios,
                    icu::Locale const &locale,
                    std::string const &encoding)
        {
            using namespace booster::locale::flags;

            std::unique_ptr<formatter<CharType> > fmt;
            ios_info &info=ios_info::get(ios);
            uint64_t disp = info.display_flags();

            icu_formatters_cache const &cache = std::use_facet<icu_formatters_cache>(ios.getloc());


            if(disp == posix)
                return fmt;
           
            UErrorCode err=U_ZERO_ERROR;
            
            switch(disp) {
            case number:
                {
                    std::ios_base::fmtflags how = (ios.flags() & std::ios_base::floatfield);
                    icu::NumberFormat *nf = 0;

                    if(how == std::ios_base::scientific)
                        nf = cache.number_format(icu_formatters_cache::fmt_sci);
                    else
                        nf = cache.number_format(icu_formatters_cache::fmt_number);
                    
                    nf->setMaximumFractionDigits(ios.precision());
                    if(how == std::ios_base::scientific || how == std::ios_base::fixed ) {
                        nf->setMinimumFractionDigits(ios.precision());
                    }
                    else {
                        nf->setMinimumFractionDigits(0);
                    }
                    fmt.reset(new number_format<CharType>(nf,encoding));
                }
                break;
            case currency:
                {
                    icu::NumberFormat *nf;
                    
                    uint64_t curr = info.currency_flags();

                    if(curr == currency_default || curr == currency_national)
                        nf = cache.number_format(icu_formatters_cache::fmt_curr_nat);
                    else
                        nf = cache.number_format(icu_formatters_cache::fmt_curr_iso);

                    fmt.reset(new number_format<CharType>(nf,encoding));
                }
                break;
            case percent:
                {
                    icu::NumberFormat *nf = cache.number_format(icu_formatters_cache::fmt_per);
                    nf->setMaximumFractionDigits(ios.precision());
                    std::ios_base::fmtflags how = (ios.flags() & std::ios_base::floatfield);
                    if(how == std::ios_base::scientific || how == std::ios_base::fixed ) {
                        nf->setMinimumFractionDigits(ios.precision());
                    }
                    else {
                        nf->setMinimumFractionDigits(0);
                    }
                    fmt.reset(new number_format<CharType>(nf,encoding));
                    
                }
                break;
            case spellout:
                fmt.reset(new number_format<CharType>(cache.number_format(icu_formatters_cache::fmt_spell),encoding));
                break;
            case ordinal:
                fmt.reset(new number_format<CharType>(cache.number_format(icu_formatters_cache::fmt_ord),encoding));
                break;
            case date:
            case time:
            case datetime:
            case strftime:
                {
                    using namespace flags;
                    std::unique_ptr<icu::DateFormat> adf;
                    icu::DateFormat *df = 0;
                    icu::SimpleDateFormat *sdf = cache.date_formatter();
                    // try to use cached first
                    if(sdf) {
                        int tmf=info.time_flags();
                        switch(tmf) {
                        case time_short:
                            tmf=0;
                            break;
                        case time_long:
                            tmf=2;
                            break;
                        case time_full:
                            tmf=3;
                            break;
                        case time_default:
                        case time_medium:
                        default:
                            tmf=1;
                        }
                        int dtf=info.date_flags();
                        switch(dtf) {
                        case date_short:
                            dtf=0;
                            break;
                        case date_long:
                            dtf=2;
                            break;
                        case date_full:
                            dtf=3;
                            break;
                        case date_default:
                        case date_medium:
                        default:
                            dtf=1;
                        }

                        icu::UnicodeString pattern;
                        switch(disp) {
                        case date:
                            pattern = cache.date_format_[dtf];
                            break;
                        case time:
                            pattern = cache.time_format_[tmf];
                            break;
                        case datetime:
                            pattern = cache.date_time_format_[dtf][tmf];
                            break;
                        case strftime:
                            {
                                if( !cache.date_format_[1].isEmpty() 
                                    && !cache.time_format_[1].isEmpty()
                                    && !cache.date_time_format_[1][1].isEmpty())
                                {
                                    icu_std_converter<CharType> cvt_(encoding);
                                    std::basic_string<CharType> const &f=info.date_time_pattern<CharType>();
                                    pattern = strftime_to_icu(cvt_.icu(f.c_str(),f.c_str()+f.size()),locale);
                                }
                            }
                            break;
                        }
                        if(!pattern.isEmpty()) {
                            sdf->applyPattern(pattern);
                            df = sdf;
                            sdf = 0;
                        }
                        sdf = 0;
                    }
                    
                    if(!df) {
                        icu::DateFormat::EStyle dstyle = icu::DateFormat::kDefault;
                        icu::DateFormat::EStyle tstyle = icu::DateFormat::kDefault;
                        
                        switch(info.time_flags()) {
                        case time_short:    tstyle=icu::DateFormat::kShort; break;
                        case time_medium:   tstyle=icu::DateFormat::kMedium; break;
                        case time_long:     tstyle=icu::DateFormat::kLong; break;
                        case time_full:     tstyle=icu::DateFormat::kFull; break;
                        }
                        switch(info.date_flags()) {
                        case date_short:    dstyle=icu::DateFormat::kShort; break;
                        case date_medium:   dstyle=icu::DateFormat::kMedium; break;
                        case date_long:     dstyle=icu::DateFormat::kLong; break;
                        case date_full:     dstyle=icu::DateFormat::kFull; break;
                        }
                        
                        if(disp==date)
                            adf.reset(icu::DateFormat::createDateInstance(dstyle,locale));
                        else if(disp==time)
                            adf.reset(icu::DateFormat::createTimeInstance(tstyle,locale));
                        else if(disp==datetime)
                            adf.reset(icu::DateFormat::createDateTimeInstance(dstyle,tstyle,locale));
                        else {// strftime
                            icu_std_converter<CharType> cvt_(encoding);
                            std::basic_string<CharType> const &f=info.date_time_pattern<CharType>();
                            icu::UnicodeString fmt = strftime_to_icu(cvt_.icu(f.data(),f.data()+f.size()),locale);
                            adf.reset(new icu::SimpleDateFormat(fmt,locale,err));
                        }
                        if(U_FAILURE(err)) 
                            return fmt;
                        df = adf.get();
                    }

                    df->adoptTimeZone(get_time_zone(info.time_zone()));
                        
                    // Depending if we own formatter or not
                    if(adf.get())
                        fmt.reset(new date_format<CharType>(std::move(adf),encoding));
                    else
                        fmt.reset(new date_format<CharType>(std::move(df),encoding));
                }
                break;
            }

            return fmt;
        }